

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

xmlRelaxNGDefinePtr_conflict xmlRelaxNGParseAttribute(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr node)

{
  int iVar1;
  xmlRelaxNGType xVar2;
  xmlRelaxNGDefinePtr_conflict def;
  xmlRelaxNGDefinePtr_conflict pxVar3;
  xmlNodePtr pxStack_38;
  int old_flags;
  xmlNodePtr child;
  xmlRelaxNGDefinePtr_conflict cur;
  xmlRelaxNGDefinePtr_conflict ret;
  xmlNodePtr node_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  def = xmlRelaxNGNewDefine(ctxt,node);
  if (def == (xmlRelaxNGDefinePtr_conflict)0x0) {
    return (xmlRelaxNGDefinePtr_conflict)0x0;
  }
  def->type = XML_RELAXNG_ATTRIBUTE;
  def->parent = ctxt->def;
  pxStack_38 = node->children;
  if (pxStack_38 == (xmlNodePtr)0x0) {
    xmlRngPErr(ctxt,node,0x3ec,"xmlRelaxNGParseattribute: attribute has no children\n",
               (xmlChar *)0x0,(xmlChar *)0x0);
    return def;
  }
  iVar1 = ctxt->flags;
  ctxt->flags = ctxt->flags | 1;
  pxVar3 = xmlRelaxNGParseNameClass(ctxt,pxStack_38,def);
  if (pxVar3 != (xmlRelaxNGDefinePtr_conflict)0x0) {
    pxStack_38 = pxStack_38->next;
  }
  if (pxStack_38 == (xmlNodePtr)0x0) goto LAB_001cc058;
  pxVar3 = xmlRelaxNGParsePattern(ctxt,pxStack_38);
  if (pxVar3 != (xmlRelaxNGDefinePtr_conflict)0x0) {
    xVar2 = pxVar3->type;
    if (xVar2 == XML_RELAXNG_NOOP) {
      xmlRngPErr(ctxt,node,0x3ed,"RNG Internal error, noop found in attribute\n",(xmlChar *)0x0,
                 (xmlChar *)0x0);
    }
    else if ((uint)xVar2 < 2) {
LAB_001cbfec:
      def->content = pxVar3;
      pxVar3->parent = def;
    }
    else {
      if (xVar2 != XML_RELAXNG_EXCEPT) {
        if ((uint)(xVar2 + ~XML_RELAXNG_EXCEPT) < 3) goto LAB_001cbfec;
        if (xVar2 != XML_RELAXNG_PARAM) {
          if ((uint)(xVar2 + ~XML_RELAXNG_PARAM) < 0xd) goto LAB_001cbfec;
          if (xVar2 != XML_RELAXNG_START) goto LAB_001cc04c;
        }
      }
      xmlRngPErr(ctxt,node,0x3eb,"attribute has invalid content\n",(xmlChar *)0x0,(xmlChar *)0x0);
    }
  }
LAB_001cc04c:
  pxStack_38 = pxStack_38->next;
LAB_001cc058:
  if (pxStack_38 != (xmlNodePtr)0x0) {
    xmlRngPErr(ctxt,node,0x3ea,"attribute has multiple children\n",(xmlChar *)0x0,(xmlChar *)0x0);
  }
  ctxt->flags = iVar1;
  return def;
}

Assistant:

static xmlRelaxNGDefinePtr
xmlRelaxNGParseAttribute(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr node)
{
    xmlRelaxNGDefinePtr ret, cur;
    xmlNodePtr child;
    int old_flags;

    ret = xmlRelaxNGNewDefine(ctxt, node);
    if (ret == NULL)
        return (NULL);
    ret->type = XML_RELAXNG_ATTRIBUTE;
    ret->parent = ctxt->def;
    child = node->children;
    if (child == NULL) {
        xmlRngPErr(ctxt, node, XML_RNGP_ATTRIBUTE_EMPTY,
                   "xmlRelaxNGParseattribute: attribute has no children\n",
                   NULL, NULL);
        return (ret);
    }
    old_flags = ctxt->flags;
    ctxt->flags |= XML_RELAXNG_IN_ATTRIBUTE;
    cur = xmlRelaxNGParseNameClass(ctxt, child, ret);
    if (cur != NULL)
        child = child->next;

    if (child != NULL) {
        cur = xmlRelaxNGParsePattern(ctxt, child);
        if (cur != NULL) {
            switch (cur->type) {
                case XML_RELAXNG_EMPTY:
                case XML_RELAXNG_NOT_ALLOWED:
                case XML_RELAXNG_TEXT:
                case XML_RELAXNG_ELEMENT:
                case XML_RELAXNG_DATATYPE:
                case XML_RELAXNG_VALUE:
                case XML_RELAXNG_LIST:
                case XML_RELAXNG_REF:
                case XML_RELAXNG_PARENTREF:
                case XML_RELAXNG_EXTERNALREF:
                case XML_RELAXNG_DEF:
                case XML_RELAXNG_ONEORMORE:
                case XML_RELAXNG_ZEROORMORE:
                case XML_RELAXNG_OPTIONAL:
                case XML_RELAXNG_CHOICE:
                case XML_RELAXNG_GROUP:
                case XML_RELAXNG_INTERLEAVE:
                case XML_RELAXNG_ATTRIBUTE:
                    ret->content = cur;
                    cur->parent = ret;
                    break;
                case XML_RELAXNG_START:
                case XML_RELAXNG_PARAM:
                case XML_RELAXNG_EXCEPT:
                    xmlRngPErr(ctxt, node, XML_RNGP_ATTRIBUTE_CONTENT,
                               "attribute has invalid content\n", NULL,
                               NULL);
                    break;
                case XML_RELAXNG_NOOP:
                    xmlRngPErr(ctxt, node, XML_RNGP_ATTRIBUTE_NOOP,
                               "RNG Internal error, noop found in attribute\n",
                               NULL, NULL);
                    break;
            }
        }
        child = child->next;
    }
    if (child != NULL) {
        xmlRngPErr(ctxt, node, XML_RNGP_ATTRIBUTE_CHILDREN,
                   "attribute has multiple children\n", NULL, NULL);
    }
    ctxt->flags = old_flags;
    return (ret);
}